

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode override_login(Curl_easy *data,connectdata *conn,char **userp,char **passwdp,
                       char **optionsp)

{
  int iVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *pcStack_50;
  int ret;
  char *npasswd;
  char *nuser;
  CURLUcode uc;
  _Bool passwd_changed;
  _Bool user_changed;
  char **optionsp_local;
  char **passwdp_local;
  char **userp_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  nuser._7_1_ = 0;
  nuser._6_1_ = 0;
  _uc = optionsp;
  optionsp_local = passwdp;
  passwdp_local = userp;
  userp_local = (char **)conn;
  conn_local = (connectdata *)data;
  if ((data->set).str[0x2c] != (char *)0x0) {
    (*Curl_cfree)(*userp);
    pcVar3 = (*Curl_cstrdup)(conn_local[1].proto.ftpc.pp.sendthis);
    *passwdp_local = pcVar3;
    if (*passwdp_local == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *(undefined1 *)(userp_local + 0x73) = 1;
    nuser._7_1_ = 1;
  }
  if (conn_local[1].proto.ftpc.pp.sendleft != 0) {
    (*Curl_cfree)(*optionsp_local);
    pcVar3 = (*Curl_cstrdup)((char *)conn_local[1].proto.ftpc.pp.sendleft);
    *optionsp_local = pcVar3;
    if (*optionsp_local == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *(undefined1 *)(userp_local + 0x73) = 1;
    nuser._6_1_ = 1;
  }
  if (conn_local[1].proto.ftpc.pp.sendsize != 0) {
    (*Curl_cfree)(*_uc);
    pcVar3 = (*Curl_cstrdup)((char *)conn_local[1].proto.ftpc.pp.sendsize);
    *_uc = pcVar3;
    if (*_uc == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  *(undefined1 *)((long)userp_local + 0x3a7) = 0;
  if (*(int *)((long)&conn_local[1].seek_func + 4) != 0) {
    npasswd = (char *)0x0;
    pcStack_50 = (char *)0x0;
    if (*(int *)((long)&conn_local[1].seek_func + 4) == 1) {
      npasswd = *passwdp_local;
    }
    iVar1 = Curl_parsenetrc(userp_local[0x1a],&npasswd,&stack0xffffffffffffffb0,
                            *(char **)(conn_local[1].syserr_buf + 0xa0));
    if (iVar1 < 1) {
      if (iVar1 < 0) {
        return CURLE_OUT_OF_MEMORY;
      }
      *(undefined1 *)((long)userp_local + 0x3a7) = 1;
      *(undefined1 *)(userp_local + 0x73) = 1;
      if (*(int *)((long)&conn_local[1].seek_func + 4) == 1) {
        if ((npasswd != (char *)0x0) && (*passwdp_local == (char *)0x0)) {
          (*Curl_cfree)(*passwdp_local);
          *passwdp_local = npasswd;
          nuser._7_1_ = 1;
        }
        if ((pcStack_50 != (char *)0x0) && (*optionsp_local == (char *)0x0)) {
          (*Curl_cfree)(*optionsp_local);
          *optionsp_local = pcStack_50;
          nuser._6_1_ = 1;
        }
      }
      else {
        if (npasswd != (char *)0x0) {
          (*Curl_cfree)(*passwdp_local);
          *passwdp_local = npasswd;
          nuser._7_1_ = 1;
        }
        if (pcStack_50 != (char *)0x0) {
          (*Curl_cfree)(*optionsp_local);
          *optionsp_local = pcStack_50;
          nuser._6_1_ = 1;
        }
      }
    }
    else {
      Curl_infof((Curl_easy *)conn_local,
                 "Couldn\'t find host %s in the .netrc file; using defaults\n",userp_local[0x1a]);
    }
  }
  if ((nuser._7_1_ & 1) != 0) {
    nuser._0_4_ = curl_url_set((CURLU *)conn_local[2].proto.imapc.mailbox_uidvalidity,CURLUPART_USER
                               ,*passwdp_local,0);
    if ((CURLUcode)nuser != CURLUE_OK) {
      CVar2 = Curl_uc_to_curlcode((CURLUcode)nuser);
      return CVar2;
    }
    nuser._0_4_ = 0;
  }
  if (((nuser._6_1_ & 1) == 0) ||
     (nuser._0_4_ = curl_url_set((CURLU *)conn_local[2].proto.imapc.mailbox_uidvalidity,
                                 CURLUPART_PASSWORD,*optionsp_local,0),
     (CURLUcode)nuser == CURLUE_OK)) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    data_local._4_4_ = Curl_uc_to_curlcode((CURLUcode)nuser);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode override_login(struct Curl_easy *data,
                               struct connectdata *conn,
                               char **userp, char **passwdp, char **optionsp)
{
  bool user_changed = FALSE;
  bool passwd_changed = FALSE;
  CURLUcode uc;
  if(data->set.str[STRING_USERNAME]) {
    free(*userp);
    *userp = strdup(data->set.str[STRING_USERNAME]);
    if(!*userp)
      return CURLE_OUT_OF_MEMORY;
    conn->bits.user_passwd = TRUE; /* enable user+password */
    user_changed = TRUE;
  }

  if(data->set.str[STRING_PASSWORD]) {
    free(*passwdp);
    *passwdp = strdup(data->set.str[STRING_PASSWORD]);
    if(!*passwdp)
      return CURLE_OUT_OF_MEMORY;
    conn->bits.user_passwd = TRUE; /* enable user+password */
    passwd_changed = TRUE;
  }

  if(data->set.str[STRING_OPTIONS]) {
    free(*optionsp);
    *optionsp = strdup(data->set.str[STRING_OPTIONS]);
    if(!*optionsp)
      return CURLE_OUT_OF_MEMORY;
  }

  conn->bits.netrc = FALSE;
  if(data->set.use_netrc != CURL_NETRC_IGNORED) {
    char *nuser = NULL;
    char *npasswd = NULL;
    int ret;

    if(data->set.use_netrc == CURL_NETRC_OPTIONAL)
      nuser = *userp; /* to separate otherwise identical machines */

    ret = Curl_parsenetrc(conn->host.name,
                          &nuser, &npasswd,
                          data->set.str[STRING_NETRC_FILE]);
    if(ret > 0) {
      infof(data, "Couldn't find host %s in the "
            DOT_CHAR "netrc file; using defaults\n",
            conn->host.name);
    }
    else if(ret < 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    else {
      /* set bits.netrc TRUE to remember that we got the name from a .netrc
         file, so that it is safe to use even if we followed a Location: to a
         different host or similar. */
      conn->bits.netrc = TRUE;
      conn->bits.user_passwd = TRUE; /* enable user+password */

      if(data->set.use_netrc == CURL_NETRC_OPTIONAL) {
        /* prefer credentials outside netrc */
        if(nuser && !*userp) {
          free(*userp);
          *userp = nuser;
          user_changed = TRUE;
        }
        if(npasswd && !*passwdp) {
          free(*passwdp);
          *passwdp = npasswd;
          passwd_changed = TRUE;
        }
      }
      else {
        /* prefer netrc credentials */
        if(nuser) {
          free(*userp);
          *userp = nuser;
          user_changed = TRUE;
        }
        if(npasswd) {
          free(*passwdp);
          *passwdp = npasswd;
          passwd_changed = TRUE;
        }
      }
    }
  }

  /* for updated strings, we update them in the URL */
  if(user_changed) {
    uc = curl_url_set(data->state.uh, CURLUPART_USER, *userp, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);
  }
  if(passwd_changed) {
    uc = curl_url_set(data->state.uh, CURLUPART_PASSWORD, *passwdp, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);
  }
  return CURLE_OK;
}